

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *focus_window;
  ImGuiWindow *window;
  int i;
  int start_idx;
  ImGuiContext *g;
  ImGuiWindow *ignore_window_local;
  ImGuiWindow *under_this_window_local;
  
  pIVar1 = GImGui;
  if (under_this_window == (ImGuiWindow *)0x0) {
    window._0_4_ = (GImGui->WindowsFocusOrder).Size;
  }
  else {
    window._0_4_ = FindWindowFocusIndex(under_this_window);
  }
  while( true ) {
    window._0_4_ = (int)window + -1;
    if ((int)window < 0) {
      FocusWindow((ImGuiWindow *)0x0);
      return;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,(int)window);
    pIVar3 = *ppIVar2;
    if (pIVar3 != pIVar3->RootWindow) break;
    if (((pIVar3 != ignore_window) && ((pIVar3->WasActive & 1U) != 0)) &&
       ((pIVar3->Flags & 0x40200U) != 0x40200)) {
      pIVar3 = NavRestoreLastChildNavWindow(pIVar3);
      FocusWindow(pIVar3);
      return;
    }
  }
  __assert_fail("window == window->RootWindow",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                ,0x1967,"void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *, ImGuiWindow *)");
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    const int start_idx = ((under_this_window != NULL) ? FindWindowFocusIndex(under_this_window) : g.WindowsFocusOrder.Size) - 1;
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        IM_ASSERT(window == window->RootWindow);
        if (window != ignore_window && window->WasActive)
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}